

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createCylinderShapeZ
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btCylinderShapeZ *in_RDI;
  btCylinderShapeZ *shape;
  btVector3 *in_stack_ffffffffffffffa8;
  btVector3 local_28;
  btCollisionShape *local_18;
  btScalar local_10;
  btScalar local_c [3];
  
  this_00 = (btCollisionShape *)btCylinderShapeZ::operator_new(0x187989);
  btVector3::btVector3(&local_28,local_c,local_c,&local_10);
  btCylinderShapeZ::btCylinderShapeZ(in_RDI,in_stack_ffffffffffffffa8);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return local_18;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCylinderShapeZ(btScalar radius,btScalar height)
{
	btCylinderShapeZ* shape = new btCylinderShapeZ(btVector3(radius,radius,height));
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}